

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O0

TestSuite * iuutil::FindTestSuite(char *testsuite_name)

{
  int iVar1;
  int iVar2;
  TestSuite *this;
  char *__s1;
  TestSuite *testsuite;
  int i;
  int testsuite_count;
  char *testsuite_name_local;
  
  if (testsuite_name != (char *)0x0) {
    iVar1 = GetTotalTestSuiteCount();
    for (testsuite._0_4_ = 0; (int)testsuite < iVar1; testsuite._0_4_ = (int)testsuite + 1) {
      this = GetTestSuite((int)testsuite);
      __s1 = iutest::TestSuite::name(this);
      iVar2 = strcmp(__s1,testsuite_name);
      if (iVar2 == 0) {
        return this;
      }
    }
  }
  return (TestSuite *)0x0;
}

Assistant:

inline const ::iutest::TestSuite* FindTestSuite(const char* testsuite_name)
{
    if( testsuite_name == NULL )
    {
        return NULL;
    }
    const int testsuite_count = ::iuutil::GetTotalTestSuiteCount();
    for( int i=0; i < testsuite_count; ++i )
    {
        const ::iutest::TestSuite* testsuite = ::iuutil::GetTestSuite(i);
        if( strcmp(testsuite->name(), testsuite_name) == 0 )
        {
            return testsuite;
        }
    }
    return NULL;
}